

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu1_v2.c
# Opt level: O3

MPP_RET hal_vp8e_vepu1_gen_regs_v2(void *hal,HalEncTask *task)

{
  long lVar1;
  undefined1 uVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  void *__s;
  MPP_RET MVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  
  iVar6 = (task->rc_task->info).quality_target;
  iVar21 = 0x7f;
  if (iVar6 < 0x7f) {
    iVar21 = iVar6;
  }
  iVar6 = 0;
  if (0 < iVar21) {
    iVar6 = iVar21;
  }
  *(int *)(*(long *)((long)hal + 0x158) + 0x18) = iVar6;
  if (*(int *)((long)hal + 0x6910) == 0) {
    MVar7 = hal_vp8e_setup(hal);
    if (MVar7 != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu1_v2","failed to init hal vp8e\n",(char *)0x0);
      return MVar7;
    }
    *(undefined4 *)((long)hal + 0x6910) = 1;
  }
  *(undefined8 *)((long)hal + 0x68f8) = 0;
  *(undefined8 *)((long)hal + 0x6900) = 0;
  *(undefined8 *)((long)hal + 0x68e8) = 0;
  *(undefined8 *)((long)hal + 0x68f0) = 0;
  *(undefined4 *)((long)hal + 0x6908) = 0;
  hal_vp8e_enc_strm_code(hal,task);
  __s = *(void **)((long)hal + 0x58);
  memset(__s,0,0x290);
  *(uint *)((long)__s + 4) = (uint)(*(int *)((long)hal + 0x160) != 0) * 2;
  if ((*(uint *)((long)hal + 0x18c) < 4) || (*(uint *)((long)hal + 0x18c) < 7)) {
    *(undefined4 *)((long)__s + 8) = 0xd00f;
  }
  else {
    *(undefined4 *)((long)__s + 8) = 0x900e;
  }
  *(undefined4 *)((long)__s + 0x14) = *(undefined4 *)((long)hal + 0x194);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),5,*(RK_U32 *)((long)hal + 0x198));
  iVar6 = *(int *)((long)hal + 0x1ac);
  *(int *)((long)__s + 0x18) = iVar6;
  uVar22 = (uint)(iVar6 != 0) << 0x1d;
  uVar8 = *(uint *)((long)__s + 0x38);
  *(uint *)((long)__s + 0x38) = uVar8 & 0xdfffffff | uVar22;
  *(uint *)((long)__s + 0x38) =
       uVar8 & 0x9fffffff | uVar22 | (uint)(*(int *)((long)hal + 0x374) != 0) << 0x1e;
  *(undefined4 *)((long)__s + 0x1c) = *(undefined4 *)((long)hal + 0x1c4);
  *(undefined4 *)((long)__s + 0x20) = *(undefined4 *)((long)hal + 0x1cc);
  *(undefined4 *)((long)__s + 0x24) = *(undefined4 *)((long)hal + 0x1bc);
  *(undefined4 *)((long)__s + 0x28) = *(undefined4 *)((long)hal + 0x1c0);
  *(undefined4 *)((long)__s + 0x2c) = *(undefined4 *)((long)hal + 0x1d4);
  if (*(RK_U32 *)((long)hal + 0x1d8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xb,*(RK_U32 *)((long)hal + 0x1d8));
  }
  *(undefined4 *)((long)__s + 0x30) = *(undefined4 *)((long)hal + 0x1dc);
  if (*(RK_U32 *)((long)hal + 0x1e0) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xc,*(RK_U32 *)((long)hal + 0x1e0));
  }
  *(undefined4 *)((long)__s + 0x34) = *(undefined4 *)((long)hal + 0x1e4);
  if (*(RK_U32 *)((long)hal + 0x1e8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xd,*(RK_U32 *)((long)hal + 0x1e8));
  }
  uVar8 = *(uint *)((long)__s + 0x38);
  *(uint *)((long)__s + 0x38) = uVar8 | 0x80000000;
  uVar22 = (*(uint *)((long)hal + 0x1b0) & 1) << 0x1c;
  *(uint *)((long)__s + 0x38) = uVar8 & 0xefffffff | 0x80000000 | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x1b4) & 1) << 6;
  *(uint *)((long)__s + 0x38) = uVar8 & 0xefffffbf | 0x80000000 | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x168) & 0x1ff) << 0x13;
  *(uint *)((long)__s + 0x38) = uVar8 & 0xe007ffbf | 0x80000000 | uVar22 | uVar23 | uVar24;
  uVar25 = (*(uint *)((long)hal + 0x164) & 0x1ff) << 10;
  *(uint *)((long)__s + 0x38) = uVar8 & 0xe00003bf | 0x80000000 | uVar22 | uVar23 | uVar24 | uVar25;
  uVar8 = (uVar8 & 0xe00003a7 | 0x80000000 | uVar22 | uVar23 | uVar24 | uVar25) +
          (*(uint *)((long)hal + 0x170) & 3) * 8;
  *(uint *)((long)__s + 0x38) = uVar8;
  *(uint *)((long)__s + 0x38) = (uVar8 & 0xfffffff9) + (*(uint *)((long)hal + 0x174) & 3) * 2;
  uVar22 = *(int *)((long)hal + 0x2fc) << 0x1d;
  uVar8 = *(uint *)((long)__s + 0x3c);
  *(uint *)((long)__s + 0x3c) = uVar8 & 0x1fffffff | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x2f8) & 7) << 0x1a;
  *(uint *)((long)__s + 0x3c) = uVar8 & 0x3ffffff | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x178) & 0x3fff) << 0xc;
  *(uint *)((long)__s + 0x3c) = uVar8 & 0xfff | uVar22 | uVar23 | uVar24;
  uVar25 = (*(uint *)((long)hal + 0x17c) & 3) << 10;
  *(uint *)((long)__s + 0x3c) = uVar8 & 0x3ff | uVar22 | uVar23 | uVar24 | uVar25;
  uVar26 = (*(uint *)((long)hal + 0x180) & 0xf) << 6;
  *(uint *)((long)__s + 0x3c) = uVar8 & 0x3f | uVar22 | uVar23 | uVar24 | uVar25 | uVar26;
  uVar8 = (uVar8 & 3 | uVar22 | uVar23 | uVar24 | uVar25 | uVar26) +
          (*(uint *)((long)hal + 0x18c) & 0xf) * 4;
  *(uint *)((long)__s + 0x3c) = uVar8;
  *(uint *)((long)__s + 0x3c) = uVar8 & 0xfffffffc | *(uint *)((long)hal + 400) & 3;
  uVar8 = *(uint *)((long)__s + 0x48) & 0xfffbffff | (*(uint *)((long)hal + 0x188) & 1) << 0x12;
  *(uint *)((long)__s + 0x48) = uVar8;
  uVar8 = CONCAT22((short)(uVar8 >> 0x10),*(undefined2 *)((long)hal + 0x310));
  *(uint *)((long)__s + 0x48) = uVar8;
  uVar22 = CONCAT22(*(undefined2 *)((long)__s + 0x56),*(undefined2 *)((long)hal + 0x318));
  *(uint *)((long)__s + 0x54) = uVar22;
  uVar23 = (*(uint *)((long)hal + 0x300) & 1) << 0x16;
  *(uint *)((long)__s + 0x48) = uVar8 & 0xffbfffff | uVar23;
  *(uint *)((long)__s + 0x48) = uVar8 & 0x3fbfffff | uVar23 | *(int *)((long)hal + 0x184) << 0x1e;
  *(uint *)((long)__s + 0x54) = uVar22 & 0xffffff | *(int *)((long)hal + 0x31c) << 0x18;
  uVar9 = (*(uint *)((long)hal + 0x4f0) & 1) << 0x1e;
  uVar8 = *(uint *)((long)__s + 0x4c);
  *(uint *)((long)__s + 0x4c) = uVar8 & 0xbfffffff | uVar9;
  uVar23 = (*(uint *)((long)hal + 0x4f4) & 0x3ff) << 0x14;
  uVar22 = *(uint *)((long)__s + 0x50);
  *(uint *)((long)__s + 0x50) = uVar22 & 0xc00fffff | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x4f8) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x50) = uVar22 & 0xc00003ff | uVar23 | uVar24;
  *(uint *)((long)__s + 0x50) =
       uVar22 & 0xc0000000 | uVar23 | uVar24 | *(uint *)((long)hal + 0x4fc) & 0x3ff;
  uVar23 = (*(uint *)((long)hal + 0x500) & 0x1ff) << 0x13;
  uVar22 = *(uint *)((long)__s + 0xf8);
  *(uint *)((long)__s + 0xf8) = uVar22 & 0xf007ffff | uVar23;
  *(uint *)((long)__s + 0xf8) = uVar22 & 0x7ffff | uVar23 | *(int *)((long)hal + 0x4ec) << 0x1c;
  *(undefined4 *)((long)__s + 0x58) = *(undefined4 *)((long)hal + 0x1a4);
  *(undefined4 *)((long)__s + 0x5c) = *(undefined4 *)((long)hal + 0x1a8);
  *(undefined4 *)((long)__s + 0x60) = *(undefined4 *)((long)hal + 0x19c);
  *(undefined4 *)((long)__s + 0x40) = *(undefined4 *)((long)hal + 0x1c8);
  *(undefined4 *)((long)__s + 0x44) = *(undefined4 *)((long)hal + 0x1d0);
  uVar10 = *(ushort *)((long)hal + 0x3d4) & 0x3fff;
  uVar22 = *(uint *)((long)__s + 0x6c);
  *(uint *)((long)__s + 0x6c) = uVar22 & 0xffffc000 | uVar10;
  uVar11 = *(ushort *)((long)hal + 0x3dc) & 0x3fff;
  uVar23 = *(uint *)((long)__s + 0x70);
  *(uint *)((long)__s + 0x70) = uVar23 & 0xffffc000 | uVar11;
  uVar12 = *(ushort *)((long)hal + 0x3e4) & 0x3fff;
  uVar24 = *(uint *)((long)__s + 0x74);
  *(uint *)((long)__s + 0x74) = uVar24 & 0xffffc000 | uVar12;
  uVar13 = *(ushort *)((long)hal + 0x3ec) & 0x3fff;
  uVar25 = *(uint *)((long)__s + 0x78);
  *(uint *)((long)__s + 0x78) = uVar25 & 0xffffc000 | uVar13;
  uVar29 = *(ushort *)((long)hal + 0x3f4) & 0x3fff;
  uVar26 = *(uint *)((long)__s + 0x7c);
  *(uint *)((long)__s + 0x7c) = uVar26 & 0xffffc000 | uVar29;
  uVar30 = *(ushort *)((long)hal + 0x3fc) & 0x3fff;
  uVar28 = *(uint *)((long)__s + 0x80);
  *(uint *)((long)__s + 0x80) = uVar28 & 0xffffc000 | uVar30;
  uVar14 = (*(ushort *)((long)hal + 0x404) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x6c) = uVar22 & 0xff800000 | uVar10 | uVar14;
  uVar15 = (*(ushort *)((long)hal + 0x40c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x70) = uVar23 & 0xff800000 | uVar11 | uVar15;
  uVar16 = (*(ushort *)((long)hal + 0x414) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x74) = uVar24 & 0xff800000 | uVar12 | uVar16;
  uVar17 = (*(ushort *)((long)hal + 0x41c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x78) = uVar25 & 0xff800000 | uVar13 | uVar17;
  uVar18 = (*(ushort *)((long)hal + 0x424) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x7c) = uVar26 & 0xff800000 | uVar29 | uVar18;
  uVar19 = (*(ushort *)((long)hal + 0x42c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x80) = uVar28 & 0xff800000 | uVar30 | uVar19;
  *(uint *)((long)__s + 0x6c) =
       uVar22 & 0x80000000 | uVar10 | uVar14 | (uint)*(byte *)((long)hal + 0x434) << 0x17;
  *(uint *)((long)__s + 0x70) =
       uVar23 & 0x80000000 | uVar11 | uVar15 | (uint)*(byte *)((long)hal + 0x438) << 0x17;
  *(uint *)((long)__s + 0x74) =
       uVar24 & 0x80000000 | uVar12 | uVar16 | (uint)*(byte *)((long)hal + 0x43c) << 0x17;
  *(uint *)((long)__s + 0x78) =
       uVar25 & 0x80000000 | uVar13 | uVar17 | (uint)*(byte *)((long)hal + 0x440) << 0x17;
  *(uint *)((long)__s + 0x7c) =
       uVar26 & 0x80000000 | uVar29 | uVar18 | (uint)*(byte *)((long)hal + 0x444) << 0x17;
  *(uint *)((long)__s + 0x80) =
       uVar28 & 0x80000000 | uVar30 | uVar19 | (uint)*(byte *)((long)hal + 0x448) << 0x17;
  uVar23 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + 0x84) >> 8),
                    *(undefined1 *)((long)hal + 0x44c));
  *(uint *)((long)__s + 0x84) = uVar23;
  uVar24 = (*(ushort *)((long)hal + 0x454) & 0x1ff) << 8;
  *(uint *)((long)__s + 0x84) = uVar23 & 0xfffe00ff | uVar24;
  uVar25 = (*(ushort *)((long)hal + 0x45c) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x84) = uVar23 & 0xfc0000ff | uVar24 | uVar25;
  uVar26 = *(ushort *)((long)hal + 0x464) & 0x1ff;
  uVar22 = *(uint *)((long)__s + 0x88);
  *(uint *)((long)__s + 0x88) = uVar22 & 0xfffffe00 | uVar26;
  uVar28 = (uint)*(byte *)((long)hal + 0x46c) << 9;
  *(uint *)((long)__s + 0x88) = uVar22 & 0xfffe0000 | uVar26 | uVar28;
  uVar10 = (*(ushort *)((long)hal + 0x474) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x88) = uVar22 & 0xfc000000 | uVar26 | uVar28 | uVar10;
  *(uint *)((long)__s + 0x84) =
       uVar23 & 0xf00000ff | uVar24 | uVar25 | (*(uint *)((long)hal + 0x484) & 3) << 0x1a;
  uVar23 = (*(uint *)((long)hal + 0x488) & 3) << 0x1a;
  *(uint *)((long)__s + 0x88) = uVar22 & 0xf0000000 | uVar26 | uVar28 | uVar10 | uVar23;
  *(uint *)((long)__s + 0x88) =
       uVar22 & 0xe0000000 | uVar26 | uVar28 | uVar10 | uVar23 |
       (*(uint *)((long)hal + 0x48c) & 1) << 0x1c;
  *(undefined4 *)((long)__s + 0x8c) = *(undefined4 *)((long)hal + 0x490);
  uVar22 = *(uint *)((long)__s + 0x90) & 0xffffe0ff | (*(uint *)((long)hal + 0x494) & 0x1f) << 8;
  *(uint *)((long)__s + 0x90) = uVar22;
  uVar22 = CONCAT31((int3)(uVar22 >> 8),*(undefined1 *)((long)hal + 0x498));
  *(uint *)((long)__s + 0x90) = uVar22;
  uVar23 = (*(uint *)((long)hal + 0x4a0) & 0x3f) << 0xf;
  *(uint *)((long)__s + 0x90) = uVar22 & 0xffe07fff | uVar23;
  uVar24 = *(int *)((long)hal + 800) << 0x18;
  *(uint *)((long)__s + 0x90) = uVar22 & 0xe07fff | uVar23 | uVar24;
  uVar25 = (*(uint *)((long)hal + 0x4b0) & 7) << 0x15;
  *(uint *)((long)__s + 0x90) = uVar22 & 0x7fff | uVar23 | uVar24 | uVar25;
  *(uint *)((long)__s + 0x90) =
       uVar22 & 0x1fff | uVar23 | uVar24 | uVar25 | (*(uint *)((long)hal + 0x49c) & 3) << 0xd;
  *(uint *)((long)__s + 0x94) =
       *(uint *)((long)__s + 0x94) & 0xe07fffff | (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x17;
  *(undefined4 *)((long)__s + 0x9c) = *(undefined4 *)((long)hal + 0x304);
  *(uint *)((long)__s + 0xa0) =
       *(uint *)((long)__s + 0xa0) & 0x3fffffff | *(int *)((long)hal + 0x308) << 0x1e;
  uVar22 = (*(uint *)((long)hal + 0x324) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x4c) = uVar8 & 0xbff003ff | uVar9 | uVar22;
  uVar23 = *(uint *)((long)hal + 0x328) & 0x3ff;
  *(uint *)((long)__s + 0x4c) = uVar8 & 0xbff00000 | uVar9 | uVar22 | uVar23;
  *(uint *)((long)__s + 0x4c) =
       uVar8 & 0x80000000 | uVar9 | uVar22 | uVar23 | (*(uint *)((long)hal + 0x32c) & 0x3ff) << 0x14
  ;
  *(undefined4 *)((long)__s + 0xcc) = *(undefined4 *)((long)hal + 0x378);
  *(undefined4 *)((long)__s + 0xd0) = *(undefined4 *)((long)hal + 0x374);
  uVar5 = *(undefined2 *)((long)hal + 900);
  *(undefined2 *)((long)__s + 0xd4) = uVar5;
  *(uint *)((long)__s + 0xd4) = CONCAT22(*(undefined2 *)((long)hal + 0x386),uVar5);
  uVar5 = *(undefined2 *)((long)hal + 0x388);
  *(undefined2 *)((long)__s + 0xd8) = uVar5;
  *(uint *)((long)__s + 0xd8) = CONCAT22(*(undefined2 *)((long)hal + 0x38a),uVar5);
  uVar8 = CONCAT22(*(undefined2 *)((long)__s + 0xde),*(undefined2 *)((long)hal + 0x38c));
  *(uint *)((long)__s + 0xdc) = uVar8;
  uVar22 = (*(byte *)((long)hal + 0x38e) & 0x1f) << 0x10;
  *(uint *)((long)__s + 0xdc) = uVar8 & 0xffe0ffff | uVar22;
  uVar23 = (*(byte *)((long)hal + 0x38f) & 0x1f) << 0x15;
  *(uint *)((long)__s + 0xdc) = uVar8 & 0xfc00ffff | uVar22 | uVar23;
  *(uint *)((long)__s + 0xdc) =
       uVar8 & 0x8000ffff | uVar22 | uVar23 | (*(byte *)((long)hal + 0x390) & 0x1f) << 0x1a;
  iVar6 = *(int *)((long)hal + 0x334);
  *(short *)((long)__s + 0xe6) = (short)iVar6;
  *(uint *)((long)__s + 0xe4) = (uint)*(ushort *)((long)hal + 0x338) | iVar6 << 0x10;
  uVar22 = *(int *)((long)hal + 0x340) << 0x18;
  uVar8 = *(uint *)((long)__s + 0xe0);
  *(uint *)((long)__s + 0xe0) = uVar8 & 0xffffff | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x348) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xe0) = uVar8 & 0xffff | uVar22 | uVar23;
  uVar8 = uVar8 & 0xff | uVar22 | uVar23 | (*(uint *)((long)hal + 0x33c) & 0xff) << 8;
  *(uint *)((long)__s + 0xe0) = uVar8;
  *(uint *)((long)__s + 0xe0) = CONCAT31((int3)(uVar8 >> 8),*(undefined1 *)((long)hal + 0x344));
  uVar22 = *(int *)((long)hal + 0x350) << 0x18;
  uVar8 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar8 & 0xffffff | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x358) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xf0) = uVar8 & 0xffff | uVar22 | uVar23;
  uVar8 = uVar8 & 0xff | uVar22 | uVar23 | (*(uint *)((long)hal + 0x34c) & 0xff) << 8;
  *(uint *)((long)__s + 0xf0) = uVar8;
  *(uint *)((long)__s + 0xf0) = CONCAT31((int3)(uVar8 >> 8),*(undefined1 *)((long)hal + 0x354));
  uVar23 = *(int *)((long)hal + 0x360) << 0x18;
  uVar8 = *(uint *)((long)__s + 0xf4);
  *(uint *)((long)__s + 0xf4) = uVar8 & 0xffffff | uVar23;
  uVar22 = (*(uint *)((long)hal + 0x368) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xf4) = uVar8 & 0xffff | uVar23 | uVar22;
  uVar8 = uVar8 & 0xff | uVar23 | uVar22 | (*(uint *)((long)hal + 0x35c) & 0xff) << 8;
  *(uint *)((long)__s + 0xf4) = uVar8;
  *(uint *)((long)__s + 0xf4) = CONCAT31((int3)(uVar8 >> 8),*(undefined1 *)((long)hal + 0x364));
  *(undefined4 *)((long)__s + 0xe8) = *(undefined4 *)((long)hal + 0x394);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x3a,*(RK_U32 *)((long)hal + 0x3b4));
  *(undefined4 *)((long)__s + 0xec) = *(undefined4 *)((long)hal + 0x398);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x3b,*(RK_U32 *)((long)hal + 0x3b8));
  *(undefined4 *)((long)__s + 0x68) = *(undefined4 *)((long)hal + 0x37c);
  uVar22 = *(uint *)((long)hal + 0x4b4) & 0xfff;
  uVar8 = *(uint *)((long)__s + 0x100);
  *(uint *)((long)__s + 0x100) = uVar8 & 0xfffff000 | uVar22;
  *(uint *)((long)__s + 0x100) =
       uVar8 & 0xff000000 | uVar22 | (*(uint *)((long)hal + 0x4b8) & 0xfff) << 0xc;
  uVar22 = *(uint *)((long)hal + 0x4bc) & 0xfff;
  uVar8 = *(uint *)((long)__s + 0x104);
  *(uint *)((long)__s + 0x104) = uVar8 & 0xfffff000 | uVar22;
  *(uint *)((long)__s + 0x104) =
       uVar8 & 0xff000000 | uVar22 | (*(uint *)((long)hal + 0x4c0) & 0xfff) << 0xc;
  lVar27 = 0;
  do {
    uVar22 = *(uint *)((long)hal + lVar27 * 8 + 0x4c4) & 0xfff;
    uVar8 = *(uint *)((long)__s + lVar27 * 4 + 0x108);
    *(uint *)((long)__s + lVar27 * 4 + 0x108) = uVar8 & 0xfffff000 | uVar22;
    *(uint *)((long)__s + lVar27 * 4 + 0x108) =
         uVar8 & 0xff000000 | uVar22 | (*(uint *)((long)hal + lVar27 * 8 + 0x4c8) & 0xfff) << 0xc;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 5);
  uVar8 = *(uint *)((long)__s + 0x88);
  uVar22 = (*(uint *)((long)hal + 0x47c) & 1) << 0x1d;
  *(uint *)((long)__s + 0x88) = uVar8 & 0xdfffffff | uVar22;
  *(uint *)((long)__s + 0x88) =
       uVar8 & 0x9fffffff | uVar22 | (*(uint *)((long)hal + 0x480) & 1) << 0x1e;
  *(undefined4 *)((long)__s + 0x11c) = *(undefined4 *)((long)hal + 0x380);
  puVar20 = (uint *)((long)__s + 0x13c);
  lVar27 = 0;
  do {
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3d6) & 0x3fff;
    uVar8 = puVar20[-7];
    puVar20[-7] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x406) & 0x1ff) << 0xe;
    puVar20[-7] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-7] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x435) << 0x17;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3de) & 0x3fff;
    uVar8 = puVar20[-6];
    puVar20[-6] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x40e) & 0x1ff) << 0xe;
    puVar20[-6] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-6] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x439) << 0x17;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3e6) & 0x3fff;
    uVar8 = puVar20[-5];
    puVar20[-5] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x416) & 0x1ff) << 0xe;
    puVar20[-5] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-5] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x43d) << 0x17;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3ee) & 0x3fff;
    uVar8 = puVar20[-4];
    puVar20[-4] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x41e) & 0x1ff) << 0xe;
    puVar20[-4] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-4] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x441) << 0x17;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3f6) & 0x3fff;
    uVar8 = puVar20[-3];
    puVar20[-3] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x426) & 0x1ff) << 0xe;
    puVar20[-3] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-3] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x445) << 0x17;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x3fe) & 0x3fff;
    uVar8 = puVar20[-2];
    puVar20[-2] = uVar8 & 0xffffc000 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar27 * 2 + 0x42e) & 0x1ff) << 0xe;
    puVar20[-2] = uVar8 & 0xff800000 | uVar22 | uVar23;
    puVar20[-2] = uVar8 & 0x80000000 | uVar22 | uVar23 |
                  (uint)*(byte *)((long)hal + lVar27 + 0x449) << 0x17;
    uVar8 = CONCAT31((int3)(puVar20[-1] >> 8),*(undefined1 *)((long)hal + lVar27 * 2 + 0x44e));
    puVar20[-1] = uVar8;
    uVar22 = (*(ushort *)((long)hal + lVar27 * 2 + 0x456) & 0x1ff) << 8;
    puVar20[-1] = uVar8 & 0xfffe00ff | uVar22;
    puVar20[-1] = uVar8 & 0xfc0000ff | uVar22 |
                  (*(ushort *)((long)hal + lVar27 * 2 + 0x45e) & 0x1ff) << 0x11;
    uVar22 = *(ushort *)((long)hal + lVar27 * 2 + 0x466) & 0x1ff;
    uVar8 = *puVar20;
    *puVar20 = uVar8 & 0xfffffe00 | uVar22;
    uVar23 = (uint)*(byte *)((long)hal + lVar27 * 2 + 0x46e) << 9;
    *puVar20 = uVar8 & 0xfffe0000 | uVar22 | uVar23;
    uVar24 = (*(ushort *)((long)hal + lVar27 * 2 + 0x476) & 0x1ff) << 0x11;
    *puVar20 = uVar8 & 0xfc000000 | uVar22 | uVar23 | uVar24;
    lVar1 = lVar27 * 4;
    lVar27 = lVar27 + 1;
    *puVar20 = uVar22 | uVar23 | uVar24 | *(int *)((long)hal + lVar1 + 0x4a4) << 0x1a;
    puVar20 = puVar20 + 8;
  } while (lVar27 != 3);
  uVar23 = *(uint *)((long)hal + 0x504) & 0x7f;
  uVar8 = *(uint *)((long)__s + 0x288);
  uVar22 = *(uint *)((long)__s + 0x28c);
  *(uint *)((long)__s + 0x288) = uVar8 & 0xffffff80 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x508) & 0x7f) << 7;
  *(uint *)((long)__s + 0x288) = uVar8 & 0xffffc000 | uVar23 | uVar24;
  uVar25 = (*(uint *)((long)hal + 0x50c) & 0x7f) << 0xe;
  *(uint *)((long)__s + 0x288) = uVar8 & 0xffe00000 | uVar23 | uVar24 | uVar25;
  *(uint *)((long)__s + 0x288) =
       uVar8 & 0xf0000000 | uVar23 | uVar24 | uVar25 | (*(uint *)((long)hal + 0x510) & 0x7f) << 0x15
  ;
  uVar23 = *(uint *)((long)hal + 0x514) & 0x7f;
  *(uint *)((long)__s + 0x28c) = uVar22 & 0xffffff80 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x518) & 0x7f) << 7;
  *(uint *)((long)__s + 0x28c) = uVar22 & 0xffffc000 | uVar23 | uVar24;
  uVar8 = (*(uint *)((long)hal + 0x51c) & 0x7f) << 0xe;
  *(uint *)((long)__s + 0x28c) = uVar22 & 0xffe00000 | uVar23 | uVar24 | uVar8;
  *(uint *)((long)__s + 0x28c) =
       uVar22 & 0xf0000000 | uVar23 | uVar24 | uVar8 | (*(uint *)((long)hal + 0x520) & 0x7f) << 0x15
  ;
  lVar27 = -0x80;
  do {
    uVar2 = *(undefined1 *)((long)hal + lVar27 + 0x27b);
    uVar8 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar27 + 0x200) >> 8),uVar2);
    *(uint *)((long)__s + lVar27 + 0x200) = uVar8;
    bVar3 = *(byte *)((long)hal + lVar27 + 0x27a);
    uVar22 = (uint)bVar3 << 8;
    *(uint *)((long)__s + lVar27 + 0x200) = uVar8 & 0xffff00ff | uVar22;
    bVar4 = *(byte *)((long)hal + lVar27 + 0x279);
    *(uint *)((long)__s + lVar27 + 0x200) = uVar8 & 0xff0000ff | uVar22 | (uint)bVar4 << 0x10;
    *(uint *)((long)__s + lVar27 + 0x200) =
         CONCAT13(*(undefined1 *)((long)hal + lVar27 + 0x278),CONCAT12(bVar4,CONCAT11(bVar3,uVar2)))
    ;
    uVar2 = *(undefined1 *)((long)hal + lVar27 + 0x2fb);
    uVar8 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar27 + 0x280) >> 8),uVar2);
    *(uint *)((long)__s + lVar27 + 0x280) = uVar8;
    bVar3 = *(byte *)((long)hal + lVar27 + 0x2fa);
    uVar22 = (uint)bVar3 << 8;
    *(uint *)((long)__s + lVar27 + 0x280) = uVar8 & 0xffff00ff | uVar22;
    bVar4 = *(byte *)((long)hal + lVar27 + 0x2f9);
    *(uint *)((long)__s + lVar27 + 0x280) = uVar8 & 0xff0000ff | uVar22 | (uint)bVar4 << 0x10;
    *(uint *)((long)__s + lVar27 + 0x280) =
         CONCAT13(*(undefined1 *)((long)hal + lVar27 + 0x2f8),CONCAT12(bVar4,CONCAT11(bVar3,uVar2)))
    ;
    lVar27 = lVar27 + 4;
  } while (lVar27 != 0);
  *(byte *)((long)__s + 0x38) = *(byte *)((long)__s + 0x38) | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp8e_vepu1_gen_regs_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    ctx->rc->qp_hdr = MPP_CLIP3(0, 127, task->rc_task->info.quality_target);

    if (!ctx->buffer_ready) {
        ret = hal_vp8e_setup(hal);
        if (ret) {
            mpp_err("failed to init hal vp8e\n");
            return ret;
        } else {
            ctx->buffer_ready = 1;
        }
    }

    memset(ctx->stream_size, 0, sizeof(ctx->stream_size));

    hal_vp8e_enc_strm_code(ctx, task);
    vp8e_vpu_frame_start(ctx);

    return MPP_OK;
}